

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O1

void nvlist_set_array_next(nvlist_t *nvl,nvpair_t *ele)

{
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      if (ele == (nvpair_t *)0x0) {
        nvl->nvl_flags = nvl->nvl_flags & 0xfffffeff;
        free(nvl->nvl_array_next);
      }
      else {
        nvl->nvl_flags = nvl->nvl_flags | 0x100;
      }
      nvl->nvl_array_next = ele;
      return;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0xdd,"void nvlist_set_array_next(nvlist_t *, nvpair_t *)");
}

Assistant:

void
nvlist_set_array_next(nvlist_t *nvl, nvpair_t *ele)
{

	NVLIST_ASSERT(nvl);

	if (ele != NULL) {
		nvl->nvl_flags |= NV_FLAG_IN_ARRAY;
	} else {
		nvl->nvl_flags &= ~NV_FLAG_IN_ARRAY;
		nv_free(nvl->nvl_array_next);
	}

	nvl->nvl_array_next = ele;
}